

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEvaluatedTargetProperty.cxx
# Opt level: O3

void AddInterfaceEntries(cmGeneratorTarget *headTarget,string *config,string *prop,string *lang,
                        cmGeneratorExpressionDAGChecker *dagChecker,
                        EvaluatedTargetPropertyEntries *entries,
                        IncludeRuntimeInterface searchRuntime,LinkInterfaceFor interfaceFor)

{
  cmLinkImplementation *pcVar1;
  const_iterator cVar2;
  undefined4 in_stack_ffffffffffffffac;
  
  if (searchRuntime == Yes) {
    pcVar1 = cmGeneratorTarget::GetLinkImplementation(headTarget,config,interfaceFor);
    if (pcVar1 == (cmLinkImplementation *)0x0) {
      return;
    }
    entries->HadContextSensitiveCondition =
         (pcVar1->super_cmLinkImplementationLibraries).HadContextSensitiveCondition;
    cVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(pcVar1->LanguageRuntimeLibraries)._M_h,lang);
    if (cVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      anon_unknown.dwarf_20083ea::addInterfaceEntry
                ((anon_unknown_dwarf_20083ea *)headTarget,(cmGeneratorTarget *)config,prop,lang,
                 (string *)dagChecker,(cmGeneratorExpressionDAGChecker *)entries,
                 (EvaluatedTargetPropertyEntries *)CONCAT44(in_stack_ffffffffffffffac,interfaceFor),
                 (LinkInterfaceFor)
                 *(undefined8 *)
                  ((long)cVar2.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
                         ._M_cur + 0x28),
                 *(vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> **)
                  ((long)cVar2.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
                         ._M_cur + 0x30));
    }
  }
  else {
    pcVar1 = (cmLinkImplementation *)
             cmGeneratorTarget::GetLinkImplementationLibraries(headTarget,config,interfaceFor);
    if (pcVar1 == (cmLinkImplementation *)0x0) {
      return;
    }
    entries->HadContextSensitiveCondition =
         (pcVar1->super_cmLinkImplementationLibraries).HadContextSensitiveCondition;
  }
  anon_unknown.dwarf_20083ea::addInterfaceEntry
            ((anon_unknown_dwarf_20083ea *)headTarget,(cmGeneratorTarget *)config,prop,lang,
             (string *)dagChecker,(cmGeneratorExpressionDAGChecker *)entries,
             (EvaluatedTargetPropertyEntries *)CONCAT44(in_stack_ffffffffffffffac,interfaceFor),
             (LinkInterfaceFor)
             (pcVar1->super_cmLinkImplementationLibraries).Libraries.
             super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
             super__Vector_impl_data._M_start,
             (vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)
             (pcVar1->super_cmLinkImplementationLibraries).Libraries.
             super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
             super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void AddInterfaceEntries(cmGeneratorTarget const* headTarget,
                         std::string const& config, std::string const& prop,
                         std::string const& lang,
                         cmGeneratorExpressionDAGChecker* dagChecker,
                         EvaluatedTargetPropertyEntries& entries,
                         IncludeRuntimeInterface searchRuntime,
                         cmGeneratorTarget::LinkInterfaceFor interfaceFor)
{
  if (searchRuntime == IncludeRuntimeInterface::Yes) {
    if (cmLinkImplementation const* impl =
          headTarget->GetLinkImplementation(config, interfaceFor)) {
      entries.HadContextSensitiveCondition =
        impl->HadContextSensitiveCondition;

      auto runtimeLibIt = impl->LanguageRuntimeLibraries.find(lang);
      if (runtimeLibIt != impl->LanguageRuntimeLibraries.end()) {
        addInterfaceEntry(headTarget, config, prop, lang, dagChecker, entries,
                          interfaceFor, runtimeLibIt->second);
      }
      addInterfaceEntry(headTarget, config, prop, lang, dagChecker, entries,
                        interfaceFor, impl->Libraries);
    }
  } else {
    if (cmLinkImplementationLibraries const* impl =
          headTarget->GetLinkImplementationLibraries(config, interfaceFor)) {
      entries.HadContextSensitiveCondition =
        impl->HadContextSensitiveCondition;
      addInterfaceEntry(headTarget, config, prop, lang, dagChecker, entries,
                        interfaceFor, impl->Libraries);
    }
  }
}